

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_go.cpp
# Opt level: O3

void __thiscall
flatbuffers::go::GoGenerator::GoGenerator
          (GoGenerator *this,Parser *parser,string *path,string *file_name,string *go_namespace)

{
  _Rb_tree_header *p_Var1;
  istream *piVar2;
  char *__end;
  long lVar3;
  long *plVar4;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  string component;
  istringstream iss;
  Config result;
  allocator_type local_692;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_691;
  string local_690;
  string local_670;
  string *local_650;
  string local_648;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_628;
  undefined1 local_5f8 [32];
  _Alloc_hider local_5d8;
  size_type local_5d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5c8;
  undefined8 local_5b8;
  _Alloc_hider local_5b0;
  size_type local_5a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5a0;
  _Alloc_hider local_590;
  size_type local_588;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_580;
  _Alloc_hider local_570;
  size_type local_568;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_560;
  _Alloc_hider local_550;
  size_type local_548;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_540;
  _Alloc_hider local_530;
  size_type local_528;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_520;
  undefined8 local_510;
  _Alloc_hider local_508;
  size_type local_500;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4f8;
  _Alloc_hider local_4e8;
  size_type local_4e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4d8;
  _Alloc_hider local_4c8;
  size_type local_4c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a0;
  undefined4 *local_480;
  undefined8 local_478;
  undefined4 local_470;
  undefined3 uStack_46c;
  undefined1 local_469;
  undefined4 *local_460;
  undefined8 local_458;
  undefined4 local_450;
  undefined1 local_44c;
  undefined8 *local_440;
  undefined8 local_438;
  undefined8 local_430;
  undefined2 local_428 [4];
  undefined4 *local_420;
  undefined8 local_418;
  undefined4 local_410;
  undefined2 local_40c;
  undefined1 local_40a;
  undefined4 *local_400;
  undefined8 local_3f8;
  undefined4 local_3f0;
  undefined1 local_3ec;
  undefined4 *local_3e0;
  undefined8 local_3d8;
  undefined4 local_3d0;
  undefined2 local_3cc;
  undefined2 *local_3c0;
  undefined8 local_3b8;
  undefined2 local_3b0;
  undefined1 local_3ae;
  undefined2 *local_3a0;
  undefined8 local_398;
  undefined2 local_390;
  undefined1 local_38e;
  undefined1 local_38d;
  undefined4 *local_380;
  undefined8 local_378;
  undefined4 local_370;
  undefined2 local_36c;
  undefined1 local_36a;
  undefined4 *local_360;
  undefined8 local_358;
  undefined4 local_350;
  undefined1 local_34c;
  undefined4 *local_340;
  undefined8 local_338;
  undefined4 local_330;
  undefined1 local_32c;
  undefined4 *local_320;
  undefined8 local_318;
  undefined4 local_310;
  undefined1 local_30c;
  undefined4 *local_300;
  undefined8 local_2f8;
  undefined4 local_2f0;
  undefined3 uStack_2ec;
  undefined1 local_2e9;
  undefined4 *local_2e0;
  undefined8 local_2d8;
  undefined4 local_2d0;
  undefined2 local_2cc;
  undefined1 local_2ca;
  undefined4 *local_2c0;
  undefined8 local_2b8;
  undefined4 local_2b0;
  undefined1 local_2ac;
  undefined1 local_2ab;
  undefined7 *local_2a0;
  undefined8 local_298;
  undefined7 local_290;
  undefined4 uStack_289;
  undefined1 local_285;
  undefined2 *local_280;
  undefined8 local_278;
  undefined2 local_270;
  undefined1 local_26e;
  undefined4 *local_260;
  undefined8 local_258;
  undefined4 local_250;
  undefined1 local_24c;
  undefined1 local_24b;
  undefined4 *local_240;
  undefined8 local_238;
  undefined4 local_230;
  undefined1 local_22c;
  undefined8 *local_220;
  undefined8 local_218;
  undefined8 local_210;
  undefined1 local_208;
  undefined2 *local_200;
  undefined8 local_1f8;
  undefined2 local_1f0;
  undefined1 local_1ee;
  undefined1 local_1ed;
  undefined4 *local_1e0;
  undefined8 local_1d8;
  undefined4 local_1d0;
  undefined2 local_1cc;
  undefined1 local_1ca;
  undefined4 *local_1c0;
  undefined8 local_1b8;
  undefined4 local_1b0;
  undefined2 uStack_1ac;
  undefined1 uStack_1aa;
  long *local_1a0 [2];
  undefined8 local_190;
  undefined1 local_180 [136];
  string local_f8 [104];
  string local_90 [32];
  string local_70 [64];
  
  local_670._M_dataplus._M_p = (pointer)&local_670.field_2;
  local_650 = go_namespace;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_670,"","");
  local_690._M_dataplus._M_p = (pointer)&local_690.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_690,"","");
  local_648._M_dataplus._M_p = (pointer)&local_648.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_648,"go","");
  BaseGenerator::BaseGenerator
            (&this->super_BaseGenerator,parser,path,file_name,&local_670,&local_690,&local_648);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_648._M_dataplus._M_p != &local_648.field_2) {
    operator_delete(local_648._M_dataplus._M_p,local_648.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_690._M_dataplus._M_p != &local_690.field_2) {
    operator_delete(local_690._M_dataplus._M_p,local_690.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_670._M_dataplus._M_p != &local_670.field_2) {
    operator_delete(local_670._M_dataplus._M_p,local_670.field_2._M_allocated_capacity + 1);
  }
  (this->super_BaseGenerator)._vptr_BaseGenerator = (_func_int **)&PTR_generate_003e96d8;
  (this->go_namespace_).components.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->go_namespace_).components.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->go_namespace_).components.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->go_namespace_).from_table = 0;
  this->cur_name_space_ = (Namespace *)0x0;
  local_5d8._M_p = (pointer)&local_5c8;
  local_5f8._0_8_ = (pointer)0x8;
  local_5f8._8_8_ = 0x100000001;
  local_5f8._16_8_ = 0x200000001;
  local_5f8._24_4_ = kKeep;
  local_5d0 = 0;
  local_5c8._M_local_buf[0] = '\0';
  local_5b8._0_4_ = AfterConvertingCase;
  local_5b8._4_4_ = kKeep;
  local_5b0._M_p = (pointer)&local_5a0;
  local_5a0._M_allocated_capacity._0_2_ = 0x5f5f;
  local_5a8 = 2;
  local_5a0._M_local_buf[2] = '\0';
  local_590._M_p = (pointer)&local_580;
  local_588 = 0;
  local_580._M_local_buf[0] = '\0';
  local_570._M_p = (pointer)&local_560;
  local_560._M_allocated_capacity._0_2_ = 0x54;
  local_568 = 1;
  local_550._M_p = (pointer)&local_540;
  local_548 = 0;
  local_540._M_local_buf[0] = '\0';
  local_530._M_p = (pointer)&local_520;
  local_520._M_local_buf[0] = '_';
  local_528 = 1;
  local_520._M_local_buf[1] = '\0';
  local_510._0_4_ = kKeep;
  local_510._4_4_ = kKeep;
  local_508._M_p = (pointer)&local_4f8;
  local_500 = 0;
  local_4f8._M_local_buf[0] = '\0';
  local_4e8._M_p = (pointer)&local_4d8;
  local_4e0 = 0;
  local_4d8._M_local_buf[0] = '\0';
  local_4c8._M_p = (pointer)&local_4b8;
  local_4b8._M_allocated_capacity._0_4_ = 0x6f672e;
  local_4c0 = 3;
  Namer::Config::Config((Config *)local_180,(Config *)local_5f8);
  std::__cxx11::string::_M_assign((string *)(local_180 + 0x68));
  std::__cxx11::string::_M_assign(local_f8);
  std::__cxx11::string::_M_assign(local_90);
  std::__cxx11::string::_M_assign(local_70);
  local_4a0._M_dataplus._M_p = (pointer)&local_4a0.field_2;
  local_4a0.field_2._M_allocated_capacity._0_4_ = 0x61657262;
  local_4a0.field_2._M_allocated_capacity._4_2_ = 0x6b;
  local_4a0._M_string_length = 5;
  local_480 = &local_470;
  local_470 = 0x61666564;
  uStack_46c = 0x746c75;
  local_478 = 7;
  local_469 = 0;
  local_460 = &local_450;
  local_450 = 0x636e7566;
  local_458 = 4;
  local_44c = 0;
  local_440 = &local_430;
  local_430 = 0x6361667265746e69;
  local_428[0] = 0x65;
  local_438 = 9;
  local_420 = &local_410;
  local_40c = 0x7463;
  local_410 = 0x656c6573;
  local_418 = 6;
  local_40a = 0;
  local_400 = &local_3f0;
  local_3f0 = 0x65736163;
  local_3f8 = 4;
  local_3ec = 0;
  local_3e0 = &local_3d0;
  local_3d0 = 0x65666564;
  local_3cc = 0x72;
  local_3d8 = 5;
  local_3c0 = &local_3b0;
  local_3b0 = 0x6f67;
  local_3b8 = 2;
  local_3ae = 0;
  local_3a0 = &local_390;
  local_38e = 0x70;
  local_390 = 0x616d;
  local_398 = 3;
  local_38d = 0;
  local_380 = &local_370;
  local_36c = 0x7463;
  local_370 = 0x75727473;
  local_378 = 6;
  local_36a = 0;
  local_360 = &local_350;
  local_350 = 0x6e616863;
  local_358 = 4;
  local_34c = 0;
  local_340 = &local_330;
  local_330 = 0x65736c65;
  local_338 = 4;
  local_32c = 0;
  local_320 = &local_310;
  local_310 = 0x6f746f67;
  local_318 = 4;
  local_30c = 0;
  local_300 = &local_2f0;
  uStack_2ec = 0x656761;
  local_2f0 = 0x6b636170;
  local_2f8 = 7;
  local_2e9 = 0;
  local_2e0 = &local_2d0;
  local_2cc = 0x6863;
  local_2d0 = 0x74697773;
  local_2d8 = 6;
  local_2ca = 0;
  local_2c0 = &local_2b0;
  local_2ac = 0x74;
  local_2b0 = 0x736e6f63;
  local_2b8 = 5;
  local_2ab = 0;
  local_2a0 = &local_290;
  local_290 = 0x7268746c6c6166;
  uStack_289 = 0x6867756f;
  local_298 = 0xb;
  local_285 = 0;
  local_280 = &local_270;
  local_270 = 0x6669;
  local_278 = 2;
  local_26e = 0;
  local_260 = &local_250;
  local_24c = 0x65;
  local_250 = 0x676e6172;
  local_258 = 5;
  local_24b = 0;
  local_240 = &local_230;
  local_230 = 0x65707974;
  local_238 = 4;
  local_22c = 0;
  local_220 = &local_210;
  local_210 = 0x65756e69746e6f63;
  local_218 = 8;
  local_208 = 0;
  local_200 = &local_1f0;
  local_1ee = 0x72;
  local_1f0 = 0x6f66;
  local_1f8 = 3;
  local_1ed = 0;
  local_1e0 = &local_1d0;
  local_1cc = 0x7472;
  local_1d0 = 0x6f706d69;
  local_1d8 = 6;
  local_1ca = 0;
  local_1c0 = &local_1b0;
  uStack_1ac = 0x6e72;
  local_1b0 = 0x75746572;
  local_1b8 = 6;
  uStack_1aa = 0;
  plVar4 = &local_190;
  local_190._2_1_ = 0x72;
  local_190._0_2_ = 0x6176;
  local_1a0[1] = (long *)0x3;
  local_190._3_1_ = 0;
  __l._M_len = 0x19;
  __l._M_array = &local_4a0;
  local_1a0[0] = plVar4;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&local_628,__l,&local_691,&local_692);
  lVar3 = -800;
  do {
    if (plVar4 != (long *)plVar4[-2]) {
      operator_delete((long *)plVar4[-2],*plVar4 + 1);
    }
    plVar4 = plVar4 + -4;
    lVar3 = lVar3 + 0x20;
  } while (lVar3 != 0);
  IdlNamer::IdlNamer(&this->namer_,(Config *)local_180,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_628);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_628);
  Namer::Config::~Config((Config *)local_180);
  Namer::Config::~Config((Config *)local_5f8);
  p_Var1 = &(this->tracked_imported_namespaces_)._M_t._M_impl.super__Rb_tree_header;
  (this->tracked_imported_namespaces_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this->tracked_imported_namespaces_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->tracked_imported_namespaces_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->tracked_imported_namespaces_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->tracked_imported_namespaces_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->needs_math_import_ = false;
  this->needs_bytes_import_ = false;
  std::__cxx11::istringstream::istringstream((istringstream *)&local_4a0,(string *)local_650,_S_in);
  local_5f8._8_8_ = 0;
  local_5f8._16_8_ = local_5f8._16_8_ & 0xffffffffffffff00;
  local_5f8._0_8_ = local_5f8 + 0x10;
  while( true ) {
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&local_4a0,(string *)local_5f8,'.');
    if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) break;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&(this->go_namespace_).components,(value_type *)local_5f8);
  }
  if ((undefined1 *)local_5f8._0_8_ != local_5f8 + 0x10) {
    operator_delete((void *)local_5f8._0_8_,local_5f8._16_8_ + 1);
  }
  std::__cxx11::istringstream::~istringstream((istringstream *)&local_4a0);
  std::ios_base::~ios_base((ios_base *)local_428);
  return;
}

Assistant:

GoGenerator(const Parser &parser, const std::string &path,
              const std::string &file_name, const std::string &go_namespace)
      : BaseGenerator(parser, path, file_name, "" /* not used*/,
                      "" /* not used */, "go"),
        cur_name_space_(nullptr),
        namer_(WithFlagOptions(GoDefaultConfig(), parser.opts, path),
               GoKeywords()) {
    std::istringstream iss(go_namespace);
    std::string component;
    while (std::getline(iss, component, '.')) {
      go_namespace_.components.push_back(component);
    }
  }